

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddRuleHash
          (cmGlobalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,string *content)

{
  cmCryptoHash *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  string_view input;
  bool bVar5;
  undefined8 *puVar6;
  reference this_01;
  pointer pcVar7;
  const_reference path;
  mapped_type *pmVar8;
  undefined1 local_b8 [8];
  string fname;
  undefined1 local_78 [8];
  string md5_hex;
  cmCryptoHash md5;
  RuleHash hash;
  string *content_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_local;
  cmGlobalGenerator *this_local;
  
  bVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(outputs);
  if (!bVar5) {
    this_00 = (cmCryptoHash *)((long)&md5_hex.field_2 + 8);
    cmCryptoHash::cmCryptoHash(this_00,AlgoMD5);
    input = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)content)
    ;
    cmCryptoHash::HashString_abi_cxx11_((string *)local_78,this_00,input);
    puVar6 = (undefined8 *)std::__cxx11::string::c_str();
    uVar1 = *puVar6;
    uVar2 = puVar6[1];
    uVar3 = puVar6[2];
    uVar4 = puVar6[3];
    std::__cxx11::string::~string((string *)local_78);
    cmCryptoHash::~cmCryptoHash((cmCryptoHash *)((long)&md5_hex.field_2 + 8));
    this_01 = std::
              vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
              ::operator[](&this->LocalGenerators,0);
    pcVar7 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (this_01);
    path = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](outputs,0);
    cmOutputConverter::MaybeRelativeToTopBinDir
              ((string *)local_b8,&pcVar7->super_cmOutputConverter,path);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
             ::operator[](&this->RuleHashes,(string *)local_b8);
    *(undefined8 *)pmVar8->Data = uVar1;
    *(undefined8 *)(pmVar8->Data + 8) = uVar2;
    *(undefined8 *)(pmVar8->Data + 0x10) = uVar3;
    *(undefined8 *)(pmVar8->Data + 0x18) = uVar4;
    std::__cxx11::string::~string((string *)local_b8);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddRuleHash(const std::vector<std::string>& outputs,
                                    std::string const& content)
{
#if !defined(CMAKE_BOOTSTRAP)
  // Ignore if there are no outputs.
  if (outputs.empty()) {
    return;
  }

  // Compute a hash of the rule.
  RuleHash hash;
  {
    cmCryptoHash md5(cmCryptoHash::AlgoMD5);
    std::string const md5_hex = md5.HashString(content);
    memcpy(hash.Data, md5_hex.c_str(), 32);
  }

  // Shorten the output name (in expected use case).
  std::string fname =
    this->LocalGenerators[0]->MaybeRelativeToTopBinDir(outputs[0]);

  // Associate the hash with this output.
  this->RuleHashes[fname] = hash;
#else
  (void)outputs;
  (void)content;
#endif
}